

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O2

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::NextBuffer<true>
          (EpsCopyInputStream *this,int overrun,int depth)

{
  char *begin;
  int iVar1;
  undefined8 uVar2;
  bool bVar3;
  size_t __n;
  char *pcVar4;
  void *data;
  LogMessage local_38;
  
  pcVar4 = this->next_chunk_;
  if (pcVar4 == (char *)0x0) {
    pcVar4 = (char *)0x0;
  }
  else {
    begin = this->patch_buffer_;
    if (pcVar4 == begin) {
      uVar2 = *(undefined8 *)(this->buffer_end_ + 8);
      *(undefined8 *)begin = *(undefined8 *)this->buffer_end_;
      *(undefined8 *)(this->patch_buffer_ + 8) = uVar2;
      if ((this->overall_limit_ < 1) ||
         ((-1 < depth && (bVar3 = ParseEndsInSlopRegion<true>(begin,overrun,depth), bVar3)))) {
LAB_00262489:
        if (this->aliasing_ == 2) {
          this->aliasing_ = (long)this->buffer_end_ - (long)pcVar4;
        }
        this->next_chunk_ = (char *)0x0;
        this->buffer_end_ = this->patch_buffer_ + 0x10;
        this->size_ = 0;
        pcVar4 = begin;
      }
      else {
        while( true ) {
          bVar3 = StreamNext(this,&data);
          if (!bVar3) {
            this->overall_limit_ = 0;
            goto LAB_00262489;
          }
          iVar1 = this->size_;
          __n = (size_t)iVar1;
          if (0x10 < (long)__n) break;
          if (0 < iVar1) {
            memcpy(this->patch_buffer_ + 0x10,data,__n);
            this->next_chunk_ = begin;
            this->buffer_end_ = begin + __n;
            goto LAB_002624f3;
          }
          if (iVar1 != 0) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_38,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.cc"
                       ,0x86,"size_ == 0");
            absl::lts_20250127::log_internal::LogMessage::operator<<(&local_38,this->size_);
            absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                      ((LogMessageFatal *)&local_38);
          }
        }
        uVar2 = *(undefined8 *)((long)data + 8);
        *(undefined8 *)(this->patch_buffer_ + 0x10) = *data;
        *(undefined8 *)(this->patch_buffer_ + 0x18) = uVar2;
        this->next_chunk_ = (char *)data;
        this->buffer_end_ = this->patch_buffer_ + 0x10;
LAB_002624f3:
        pcVar4 = begin;
        if (1 < this->aliasing_) {
          this->aliasing_ = 1;
        }
      }
    }
    else {
      if ((long)this->size_ < 0x11) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_38,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.cc"
                   ,0x65,"size_ > kSlopBytes");
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_38);
      }
      this->buffer_end_ = pcVar4 + (long)this->size_ + -0x10;
      this->next_chunk_ = begin;
      if (this->aliasing_ == 1) {
        this->aliasing_ = 2;
      }
    }
  }
  return pcVar4;
}

Assistant:

const char* EpsCopyInputStream::NextBuffer(int overrun, int depth) {
  if (next_chunk_ == nullptr) return nullptr;  // We've reached end of stream.
  if (next_chunk_ != patch_buffer_) {
    ABSL_DCHECK(size_ > kSlopBytes);
    // The chunk is large enough to be used directly
    buffer_end_ = next_chunk_ + size_ - kSlopBytes;
    auto res = next_chunk_;
    next_chunk_ = patch_buffer_;
    if (aliasing_ == kOnPatch) aliasing_ = kNoDelta;
    return res;
  }
  // Move the slop bytes of previous buffer to start of the patch buffer.
  // Note we must use memmove because the previous buffer could be part of
  // patch_buffer_.
  std::memmove(patch_buffer_, buffer_end_, kSlopBytes);
  if (overall_limit_ > 0 &&
      (depth < 0 || !ParseEndsInSlopRegion<kExperimentalV2>(patch_buffer_,
                                                            overrun, depth))) {
    const void* data;
    // ZeroCopyInputStream indicates Next may return 0 size buffers. Hence
    // we loop.
    while (StreamNext(&data)) {
      if (size_ > kSlopBytes) {
        // We got a large chunk
        std::memcpy(patch_buffer_ + kSlopBytes, data, kSlopBytes);
        next_chunk_ = static_cast<const char*>(data);
        buffer_end_ = patch_buffer_ + kSlopBytes;
        if (aliasing_ >= kNoDelta) aliasing_ = kOnPatch;
        return patch_buffer_;
      } else if (size_ > 0) {
        std::memcpy(patch_buffer_ + kSlopBytes, data, size_);
        next_chunk_ = patch_buffer_;
        buffer_end_ = patch_buffer_ + size_;
        if (aliasing_ >= kNoDelta) aliasing_ = kOnPatch;
        return patch_buffer_;
      }
      ABSL_DCHECK(size_ == 0) << size_;
    }
    overall_limit_ = 0;  // Next failed, no more needs for next
  }
  // End of stream or array
  if (aliasing_ == kNoDelta) {
    // If there is no more block and aliasing is true, the previous block
    // is still valid and we can alias. We have users relying on string_view's
    // obtained from protos to outlive the proto, when the parse was from an
    // array. This guarantees string_view's are always aliased if parsed from
    // an array.
    aliasing_ = reinterpret_cast<std::uintptr_t>(buffer_end_) -
                reinterpret_cast<std::uintptr_t>(patch_buffer_);
  }
  next_chunk_ = nullptr;
  buffer_end_ = patch_buffer_ + kSlopBytes;
  size_ = 0;
  return patch_buffer_;
}